

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlCreateInputBuffer(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlParserInputBufferPtr buffer_00;
  xmlParserInputBufferPtr buffer;
  char *pcStack_38;
  xmlCharEncoding enc;
  xmlChar *encoding;
  PyObject *file;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  buffer._4_4_ = XML_CHAR_ENCODING_NONE;
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"Oz:xmlParserInputBufferCreate",&encoding,&stack0xffffffffffffffc8);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if ((pcStack_38 != (char *)0x0) && (*pcStack_38 != '\0')) {
      buffer._4_4_ = xmlParseCharEncoding(pcStack_38);
    }
    buffer_00 = xmlParserInputBufferCreatePythonFile((PyObject *)encoding,buffer._4_4_);
    if (buffer_00 == (xmlParserInputBufferPtr)0x0) {
      printf("libxml_xmlParserInputBufferCreate: buffer == NULL\n");
    }
    self_local = libxml_xmlParserInputBufferPtrWrap(buffer_00);
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlCreateInputBuffer(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    PyObject *py_retval;
    PyObject *file;
    xmlChar  *encoding;
    xmlCharEncoding enc = XML_CHAR_ENCODING_NONE;
    xmlParserInputBufferPtr buffer;


    if (!PyArg_ParseTuple(args, (char *)"Oz:xmlParserInputBufferCreate",
		&file, &encoding))
	return(NULL);
    if ((encoding != NULL) && (encoding[0] != 0)) {
	enc = xmlParseCharEncoding((const char *) encoding);
    }
    buffer = xmlParserInputBufferCreatePythonFile(file, enc);
    if (buffer == NULL)
	printf("libxml_xmlParserInputBufferCreate: buffer == NULL\n");
    py_retval = libxml_xmlParserInputBufferPtrWrap(buffer);
    return(py_retval);
}